

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O2

opj_image_t * pngtoimage(char *read_idf,opj_cparameters_t *params)

{
  bool bVar1;
  OPJ_BYTE **__ptr;
  FILE *__stream;
  size_t sVar2;
  png_structp png_00;
  opj_image_t *poVar3;
  ulong uVar4;
  ulong uVar5;
  png_uint_32 height;
  OPJ_INT32 *row32s;
  png_infop info;
  png_structp png;
  OPJ_BYTE **rows;
  OPJ_BYTE sigbuf [8];
  
  png = (png_structp)0x0;
  info = (png_infop)0x0;
  height = 0;
  rows = (OPJ_BYTE **)0x0;
  row32s = (OPJ_INT32 *)0x0;
  __stream = fopen(read_idf,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pngtoimage: can not open %s\n",read_idf);
    return (opj_image_t *)0x0;
  }
  sVar2 = fread(sigbuf,1,8,__stream);
  if ((sVar2 == 8) && (sigbuf == (OPJ_BYTE  [8])0xa1a0a0d474e5089)) {
    png_00 = (png_structp)png_create_read_struct("1.6.37",0,0,0);
    png = png_00;
    if (png_00 != (png_structp)0x0) {
      info = (png_infop)png_create_info_struct(png_00);
      if (info == (png_infop)0x0) {
        poVar3 = (opj_image_t *)0x0;
      }
      else {
        poVar3 = pngtoimage_internal(params,(FILE *)__stream,png_00,info,&height,&rows,&row32s);
        __ptr = rows;
        if (rows != (OPJ_BYTE **)0x0) {
          uVar4 = (ulong)height;
          for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
            free(__ptr[uVar5]);
          }
          free(__ptr);
        }
      }
      bVar1 = false;
      goto LAB_001112e7;
    }
  }
  else {
    fprintf(_stderr,"pngtoimage: %s is no valid PNG file\n",read_idf);
  }
  poVar3 = (opj_image_t *)0x0;
  bVar1 = true;
LAB_001112e7:
  free(row32s);
  if (!bVar1) {
    png_destroy_read_struct(&png,&info,0);
  }
  fclose(__stream);
  return poVar3;
}

Assistant:

opj_image_t *pngtoimage(const char *read_idf, opj_cparameters_t * params)
{
    png_structp  png = NULL;
    png_infop    info = NULL;
    OPJ_UINT32 i;
    png_uint_32  height = 0U;
    FILE *reader = NULL;
    OPJ_BYTE** rows = NULL;
    OPJ_INT32* row32s = NULL;
    OPJ_BYTE sigbuf[8];
    opj_image_t *image = NULL;

    if ((reader = fopen(read_idf, "rb")) == NULL) {
        fprintf(stderr, "pngtoimage: can not open %s\n", read_idf);
        return NULL;
    }

    if (fread(sigbuf, 1, MAGIC_SIZE, reader) != MAGIC_SIZE
            || memcmp(sigbuf, PNG_MAGIC, MAGIC_SIZE) != 0) {
        fprintf(stderr, "pngtoimage: %s is no valid PNG file\n", read_idf);
        goto fin;
    }

    if ((png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
                                      NULL, NULL, NULL)) == NULL) {
        goto fin;
    }
    if ((info = png_create_info_struct(png)) == NULL) {
        goto fin;
    }

    image = pngtoimage_internal(params, reader, png, info, &height, &rows, &row32s);
fin:
    if (rows) {
        for (i = 0; i < height; ++i)
            if (rows[i]) {
                free(rows[i]);
            }
        free(rows);
    }
    if (row32s) {
        free(row32s);
    }
    if (png) {
        png_destroy_read_struct(&png, &info, NULL);
    }

    fclose(reader);

    return image;

}